

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collision.cpp
# Opt level: O1

int __thiscall
CCollision::IntersectLine
          (CCollision *this,vec2 Pos0,vec2 Pos1,vec2 *pOutCollision,vec2 *pOutBeforeCollision)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar6;
  float fVar7;
  anon_union_4_2_94730284_for_vector2_base<float>_1 x;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar8;
  float fVar9;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 y;
  int local_b0;
  vec2 local_88;
  
  aVar6 = Pos0.field_0;
  aVar8 = Pos0.field_1;
  fVar7 = aVar6.x - Pos1.field_0.x;
  fVar9 = aVar8.y - Pos1.field_1.y;
  fVar7 = fVar7 * fVar7 + fVar9 * fVar9;
  if (fVar7 < 0.0) {
    fVar7 = sqrtf(fVar7);
  }
  else {
    fVar7 = SQRT(fVar7);
  }
  uVar3 = (uint)(fVar7 + 1.0);
  uVar5 = uVar3 >> 0x1f;
  if (-1 < (int)uVar3) {
    iVar4 = 0;
    local_88 = Pos0;
    do {
      fVar9 = (float)iVar4 * (1.0 / (float)(int)(fVar7 + 1.0));
      x.x = fVar9 * (Pos1.field_0.x - aVar6.x) + aVar6.x;
      y.y = fVar9 * (Pos1.field_1.y - aVar8.y) + aVar8.y;
      bVar2 = CheckPoint(this,x.x,y.y,1);
      if (bVar2) {
        if (pOutCollision != (vec2 *)0x0) {
          (pOutCollision->field_0).x = (float)x;
          (pOutCollision->field_1).y = (float)y;
        }
        if (pOutBeforeCollision != (vec2 *)0x0) {
          *pOutBeforeCollision = local_88;
        }
        local_b0 = GetCollisionAt(this,x.x,y.y);
      }
      else {
        local_88.field_1.y = y.y;
        local_88.field_0.x = x.x;
      }
      if (bVar2) break;
      iVar1 = iVar4 + 1;
      uVar5 = (uint)((int)uVar3 <= iVar4);
      iVar4 = iVar1;
    } while (uVar3 + 1 != iVar1);
  }
  if (uVar5 != 0) {
    if (pOutCollision != (vec2 *)0x0) {
      *pOutCollision = Pos1;
    }
    local_b0 = 0;
    if (pOutBeforeCollision != (vec2 *)0x0) {
      *pOutBeforeCollision = Pos1;
    }
  }
  return local_b0;
}

Assistant:

int CCollision::IntersectLine(vec2 Pos0, vec2 Pos1, vec2 *pOutCollision, vec2 *pOutBeforeCollision) const
{
	const int End = distance(Pos0, Pos1)+1;
	const float InverseEnd = 1.0f/End;
	vec2 Last = Pos0;

	for(int i = 0; i <= End; i++)
	{
		vec2 Pos = mix(Pos0, Pos1, i*InverseEnd);
		if(CheckPoint(Pos.x, Pos.y))
		{
			if(pOutCollision)
				*pOutCollision = Pos;
			if(pOutBeforeCollision)
				*pOutBeforeCollision = Last;
			return GetCollisionAt(Pos.x, Pos.y);
		}
		Last = Pos;
	}
	if(pOutCollision)
		*pOutCollision = Pos1;
	if(pOutBeforeCollision)
		*pOutBeforeCollision = Pos1;
	return 0;
}